

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Float pbrt::CosDPhi(Vector3f wa,Vector3f wb)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  Float FVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  
  auVar8._8_56_ = wb._8_56_;
  auVar8._0_8_ = wb.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = wa._8_56_;
  auVar7._0_8_ = wa.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10 = vmovshdup_avx(auVar7._0_16_);
  fVar9 = auVar10._0_4_;
  fVar5 = wa.super_Tuple3<pbrt::Vector3,_float>.x * wa.super_Tuple3<pbrt::Vector3,_float>.x +
          fVar9 * fVar9;
  FVar4 = 1.0;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar10 = vmovshdup_avx(auVar8._0_16_);
    fVar11 = auVar10._0_4_;
    fVar1 = fVar11 * fVar11 +
            wb.super_Tuple3<pbrt::Vector3,_float>.x * wb.super_Tuple3<pbrt::Vector3,_float>.x;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar11)),auVar8._0_16_,auVar7._0_16_);
      fVar5 = fVar5 * fVar1;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
        auVar10 = ZEXT416(auVar10._0_4_);
      }
      else {
        auVar6 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
        fVar5 = auVar6._0_4_;
      }
      auVar6._0_4_ = auVar10._0_4_ / fVar5;
      auVar6._4_12_ = auVar10._4_12_;
      auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar6);
      uVar2 = vcmpss_avx512f(auVar6,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      FVar4 = (Float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar10._0_4_);
    }
  }
  return FVar4;
}

Assistant:

PBRT_CPU_GPU inline Float CosDPhi(Vector3f wa, Vector3f wb) {
    Float waxy = Sqr(wa.x) + Sqr(wa.y), wbxy = Sqr(wb.x) + Sqr(wb.y);
    if (waxy == 0 || wbxy == 0)
        return 1;
    return Clamp((wa.x * wb.x + wa.y * wb.y) / std::sqrt(waxy * wbxy), -1, 1);
}